

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O0

void __thiscall BS::thread_pool::~thread_pool(thread_pool *this)

{
  thread_pool *this_local;
  
  wait_for_tasks(this);
  destroy_threads(this);
  std::unique_ptr<std::thread[],_std::default_delete<std::thread[]>_>::~unique_ptr(&this->threads);
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::~queue(&this->tasks);
  std::condition_variable::~condition_variable(&this->task_done_cv);
  std::condition_variable::~condition_variable(&this->task_available_cv);
  return;
}

Assistant:

~thread_pool()
    {
        wait_for_tasks();
        destroy_threads();
    }